

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateMethodSignatures
          (ServiceGenerator *this,VirtualOrNot virtual_or_not,Printer *printer)

{
  MethodDescriptor *pMVar1;
  cpp *pcVar2;
  long lVar3;
  allocator<char> local_4f5;
  allocator<char> local_4f4;
  allocator<char> local_4f3;
  allocator<char> local_4f2;
  allocator<char> local_4f1;
  Options *local_4f0;
  int local_4e4;
  Sub *local_4e0;
  Sub *local_4d8;
  Printer *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  Sub local_3c8 [4];
  Sub local_e8;
  
  local_4d8 = local_3c8 + 2;
  local_4e0 = local_3c8 + 3;
  local_4c8 = "";
  local_4c0 = "";
  if (virtual_or_not == kVirtual) {
    local_4c0 = "virtual";
  }
  else {
    local_4c8 = "override";
  }
  local_4f0 = (Options *)this;
  local_4d0 = printer;
  for (local_4e4 = 0; local_4e4 < *(int *)((ServiceDescriptor *)local_4f0->access_info_map + 0x38);
      local_4e4 = local_4e4 + 1) {
    pMVar1 = ServiceDescriptor::method((ServiceDescriptor *)local_4f0->access_info_map,local_4e4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"name",&local_4f1);
    io::Printer::Sub::Sub<std::__cxx11::string_const&>
              (local_3c8,&local_448,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pMVar1 + 8));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"input",&local_4f2);
    pcVar2 = (cpp *)google::protobuf::MethodDescriptor::input_type();
    QualifiedClassName_abi_cxx11_(&local_408,pcVar2,(Descriptor *)local_4f0->split_map,local_4f0);
    io::Printer::Sub::Sub<std::__cxx11::string>(local_3c8 + 1,&local_3e8,&local_408);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"output",&local_4f3);
    pcVar2 = (cpp *)google::protobuf::MethodDescriptor::output_type();
    QualifiedClassName_abi_cxx11_(&local_468,pcVar2,(Descriptor *)local_4f0->split_map,local_4f0);
    io::Printer::Sub::Sub<std::__cxx11::string>(local_3c8 + 2,&local_4a8,&local_468);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"virtual",&local_4f4);
    local_4b0 = local_4c0;
    io::Printer::Sub::Sub<char_const*>(local_3c8 + 3,&local_488,&local_4b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"override",&local_4f5);
    local_4b8 = local_4c8;
    io::Printer::Sub::Sub<char_const*>(&local_e8,&local_428,&local_4b8);
    google::protobuf::io::Printer::Emit
              (local_4d0,local_3c8,5,0x10d,
               "\n          $virtual $void $name$(::$proto_ns$::RpcController* controller,\n                                const $input$* request,\n                                $output$* response,\n                                ::google::protobuf::Closure* done)$ override$;\n        "
              );
    lVar3 = 0x2e0;
    do {
      io::Printer::Sub::~Sub((Sub *)((long)&local_3c8[0].key_._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0xb8;
    } while (lVar3 != -0xb8);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_448);
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateMethodSignatures(VirtualOrNot virtual_or_not,
                                                io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); ++i) {
    const MethodDescriptor* method = descriptor_->method(i);

    printer->Emit(
        {
            {"name", method->name()},
            {"input", QualifiedClassName(method->input_type(), *options_)},
            {"output", QualifiedClassName(method->output_type(), *options_)},
            {"virtual", virtual_or_not == kVirtual ? "virtual" : ""},
            {"override", virtual_or_not != kVirtual ? "override" : ""},
        },
        // No cc, clang-format does not format this string well due to the
        // $ override$ substitution.
        R"(
          $virtual $void $name$(::$proto_ns$::RpcController* controller,
                                const $input$* request,
                                $output$* response,
                                ::google::protobuf::Closure* done)$ override$;
        )");
  }
}